

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgsequ.c
# Opt level: O3

void cgsequ(SuperMatrix *A,float *r,float *c,float *rowcnd,float *colcnd,float *amax,int *info)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  singlecomplex *psVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int ii;
  int local_34;
  
  *info = 0;
  if ((((A->nrow < 0) || (A->ncol < 0)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_C || (A->Mtype != SLU_GE)))) {
    *info = -1;
    local_34 = 1;
    input_error("cgsequ",&local_34);
    return;
  }
  if (A->nrow == 0 || A->ncol == 0) {
    *rowcnd = 1.0;
    *colcnd = 1.0;
    *amax = 0.0;
    return;
  }
  pvVar1 = A->Store;
  lVar2 = *(long *)((long)pvVar1 + 8);
  fVar13 = smach("S");
  uVar12 = A->nrow;
  if (0 < (long)(int)uVar12) {
    memset(r,0,(long)(int)uVar12 * 4);
  }
  uVar9 = A->ncol;
  if (0 < (int)uVar9) {
    lVar5 = *(long *)((long)pvVar1 + 0x18);
    lVar7 = 0;
    do {
      iVar3 = *(int *)(lVar5 + lVar7 * 4);
      lVar8 = (long)iVar3;
      lVar10 = lVar7 + 1;
      if (iVar3 < *(int *)(lVar5 + 4 + lVar7 * 4)) {
        psVar11 = (singlecomplex *)(lVar2 + lVar8 * 8);
        do {
          iVar3 = *(int *)(*(long *)((long)pvVar1 + 0x10) + lVar8 * 4);
          fVar14 = r[iVar3];
          dVar15 = c_abs1(psVar11);
          if ((double)fVar14 <= dVar15) {
            dVar15 = c_abs1(psVar11);
            fVar14 = (float)dVar15;
          }
          else {
            fVar14 = r[iVar3];
          }
          r[iVar3] = fVar14;
          lVar8 = lVar8 + 1;
          lVar5 = *(long *)((long)pvVar1 + 0x18);
          psVar11 = psVar11 + 1;
        } while (lVar8 < *(int *)(lVar5 + lVar10 * 4));
        uVar9 = A->ncol;
      }
      lVar7 = lVar10;
    } while (lVar10 < (int)uVar9);
    uVar12 = A->nrow;
  }
  fVar18 = 1.0 / fVar13;
  fVar14 = fVar18;
  if ((int)uVar12 < 1) {
    *amax = 0.0;
    fVar17 = 0.0;
    if ((fVar18 == 0.0) && (!NAN(fVar18))) goto LAB_00104111;
  }
  else {
    uVar4 = (ulong)uVar12;
    fVar17 = 0.0;
    uVar6 = 0;
    do {
      fVar16 = r[uVar6];
      if (fVar17 <= fVar16) {
        fVar17 = fVar16;
      }
      if (fVar16 <= fVar14) {
        fVar14 = fVar16;
      }
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
    *amax = fVar17;
    if ((fVar14 == 0.0) && (!NAN(fVar14))) {
      if (0 < (int)uVar12) {
        uVar6 = 0;
        do {
          if ((r[uVar6] == 0.0) && (!NAN(r[uVar6]))) {
            *info = (int)uVar6 + 1;
            return;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      goto LAB_00104111;
    }
    if (0 < (int)uVar12) {
      uVar6 = 0;
      do {
        fVar16 = r[uVar6];
        if (r[uVar6] <= fVar13) {
          fVar16 = fVar13;
        }
        if (fVar18 <= fVar16) {
          fVar16 = fVar18;
        }
        r[uVar6] = 1.0 / fVar16;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  if (fVar14 <= fVar13) {
    fVar14 = fVar13;
  }
  if (fVar18 <= fVar17) {
    fVar17 = fVar18;
  }
  *rowcnd = fVar14 / fVar17;
LAB_00104111:
  fVar14 = fVar18;
  if ((int)uVar9 < 1) {
    fVar17 = 0.0;
    if ((fVar18 == 0.0) && (!NAN(fVar18))) {
      return;
    }
  }
  else {
    memset(c,0,(ulong)uVar9 << 2);
    uVar4 = (ulong)uVar9;
    lVar5 = *(long *)((long)pvVar1 + 0x18);
    lVar7 = 0;
    do {
      iVar3 = *(int *)(lVar5 + lVar7 * 4);
      lVar10 = (long)iVar3;
      lVar8 = lVar7 + 1;
      if (iVar3 < *(int *)(lVar5 + 4 + lVar7 * 4)) {
        fVar17 = c[lVar7];
        psVar11 = (singlecomplex *)(lVar2 + lVar10 * 8);
        do {
          iVar3 = *(int *)(*(long *)((long)pvVar1 + 0x10) + lVar10 * 4);
          dVar15 = c_abs1(psVar11);
          if ((double)fVar17 <= (double)r[iVar3] * dVar15) {
            dVar15 = c_abs1(psVar11);
            fVar17 = (float)((double)r[iVar3] * dVar15);
          }
          else {
            fVar17 = c[lVar7];
          }
          c[lVar7] = fVar17;
          lVar10 = lVar10 + 1;
          lVar5 = *(long *)((long)pvVar1 + 0x18);
          psVar11 = psVar11 + 1;
        } while (lVar10 < *(int *)(lVar5 + lVar8 * 4));
        uVar4 = (ulong)(uint)A->ncol;
      }
      iVar3 = (int)uVar4;
      lVar7 = lVar8;
    } while (lVar8 < iVar3);
    fVar17 = 0.0;
    if (0 < iVar3) {
      uVar6 = 0;
      do {
        fVar16 = c[uVar6];
        if (fVar17 <= fVar16) {
          fVar17 = fVar16;
        }
        if (fVar16 <= fVar14) {
          fVar14 = fVar16;
        }
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    if ((fVar14 == 0.0) && (!NAN(fVar14))) {
      if (iVar3 < 1) {
        return;
      }
      iVar3 = -1;
      uVar6 = 0;
      while ((c[uVar6] != 0.0 || (NAN(c[uVar6])))) {
        uVar6 = uVar6 + 1;
        iVar3 = iVar3 + -1;
        if (uVar4 == uVar6) {
          return;
        }
      }
      *info = A->nrow - iVar3;
      return;
    }
    if (0 < iVar3) {
      uVar6 = 0;
      do {
        fVar16 = c[uVar6];
        if (c[uVar6] <= fVar13) {
          fVar16 = fVar13;
        }
        if (fVar18 <= fVar16) {
          fVar16 = fVar18;
        }
        c[uVar6] = 1.0 / fVar16;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  if (fVar14 <= fVar13) {
    fVar14 = fVar13;
  }
  if (fVar18 <= fVar17) {
    fVar17 = fVar18;
  }
  *colcnd = fVar14 / fVar17;
  return;
}

Assistant:

void
cgsequ(SuperMatrix *A, float *r, float *c, float *rowcnd,
	float *colcnd, float *amax, int *info)
{


    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int_t i, j;
    int   irow;
    float rcmin, rcmax;
    float bignum, smlnum;
    extern float smach(char *);
    
    /* Test the input parameters. */
    *info = 0;
    if ( A->nrow < 0 || A->ncol < 0 ||
	 A->Stype != SLU_NC || A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -1;
    if (*info != 0) {
	int ii = -(*info);
	input_error("cgsequ", &ii);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || A->ncol == 0 ) {
	*rowcnd = 1.;
	*colcnd = 1.;
	*amax = 0.;
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Get machine constants. */
    smlnum = smach("S");  /* slamch_("S"); */
    bignum = 1. / smlnum;

    /* Compute row scale factors. */
    for (i = 0; i < A->nrow; ++i) r[i] = 0.;

    /* Find the maximum element in each row. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    r[irow] = SUPERLU_MAX( r[irow], c_abs1(&Aval[i]) );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (i = 0; i < A->nrow; ++i) {
	rcmax = SUPERLU_MAX(rcmax, r[i]);
	rcmin = SUPERLU_MIN(rcmin, r[i]);
    }
    *amax = rcmax;

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (i = 0; i < A->nrow; ++i)
	    if (r[i] == 0.) {
		*info = i + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (i = 0; i < A->nrow; ++i)
	    r[i] = 1. / SUPERLU_MIN( SUPERLU_MAX( r[i], smlnum ), bignum );
	/* Compute ROWCND = min(R(I)) / max(R(I)) */
	*rowcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    /* Compute column scale factors */
    for (j = 0; j < A->ncol; ++j) c[j] = 0.;

    /* Find the maximum element in each column, assuming the row
       scalings computed above. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    c[j] = SUPERLU_MAX( c[j], c_abs1(&Aval[i]) * r[irow] );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (j = 0; j < A->ncol; ++j) {
	rcmax = SUPERLU_MAX(rcmax, c[j]);
	rcmin = SUPERLU_MIN(rcmin, c[j]);
    }

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (j = 0; j < A->ncol; ++j)
	    if ( c[j] == 0. ) {
		*info = A->nrow + j + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (j = 0; j < A->ncol; ++j)
	    c[j] = 1. / SUPERLU_MIN( SUPERLU_MAX( c[j], smlnum ), bignum);
	/* Compute COLCND = min(C(J)) / max(C(J)) */
	*colcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    return;

}